

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn2.hpp
# Opt level: O3

ret_t trng::utility::u01xx_traits<double,_1UL,_trng::yarn2>::addin(yarn2 *r)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar1 = (r->S).r[0];
  uVar5 = (long)(r->S).r[1] * (long)(r->P).a[1] + (long)(r->P).a[0] * (long)iVar1;
  uVar6 = (uVar5 >> 0x1f) + (uVar5 & 0x7fffffff);
  uVar5 = uVar6 - 0xfffffffe;
  if (uVar6 < 0xfffffffe) {
    uVar5 = uVar6;
  }
  (r->S).r[1] = iVar1;
  uVar2 = (uint)uVar5 + 0x80000001;
  if (uVar5 < 0x7fffffff) {
    uVar2 = (uint)uVar5;
  }
  (r->S).r[0] = uVar2;
  if (uVar2 != 0) {
    uVar3 = (uint)((ulong)*(uint *)(yarn2::g + (ulong)(uVar2 & 0xffff) * 4) *
                  (ulong)*(uint *)(yarn2::g + (long)((int)uVar2 >> 0x10) * 4 + 0x40000)) &
            0x7fffffff;
    iVar1 = (int)((ulong)*(uint *)(yarn2::g + (ulong)(uVar2 & 0xffff) * 4) *
                  (ulong)*(uint *)(yarn2::g + (long)((int)uVar2 >> 0x10) * 4 + 0x40000) >> 0x1f);
    uVar4 = uVar3 + iVar1;
    uVar2 = uVar3 + 0x80000001 + iVar1;
    if (uVar4 < 0x7fffffff) {
      uVar2 = uVar4;
    }
    return (double)(int)uVar2;
  }
  return 0.0;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn2::step() {
    const uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
                     static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1])};
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 2>(t);
  }